

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AST.h
# Opt level: O1

void __thiscall
flow::lang::LiteralExpr<long_long>::LiteralExpr(LiteralExpr<long_long> *this,longlong *value)

{
  undefined1 local_40 [16];
  undefined4 local_30;
  undefined4 uStack_2c;
  undefined4 uStack_28;
  undefined4 uStack_24;
  undefined8 local_20;
  
  local_40[0] = 0;
  local_30 = 1;
  uStack_2c = 1;
  uStack_28 = 0;
  uStack_24 = 1;
  local_20 = 1;
  (this->super_Expr).super_ASTNode._vptr_ASTNode = (_func_int **)&PTR__ASTNode_001947b0;
  (this->super_Expr).super_ASTNode.location_.filename._M_dataplus._M_p =
       (pointer)&(this->super_Expr).super_ASTNode.location_.filename.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->super_Expr).super_ASTNode.location_,local_40,local_40);
  (this->super_Expr).super_ASTNode.location_.end.column = (undefined4)local_20;
  (this->super_Expr).super_ASTNode.location_.end.offset = local_20._4_4_;
  (this->super_Expr).super_ASTNode.location_.begin.line = local_30;
  (this->super_Expr).super_ASTNode.location_.begin.column = uStack_2c;
  *(ulong *)&(this->super_Expr).super_ASTNode.location_.begin.offset = CONCAT44(uStack_24,uStack_28)
  ;
  (this->super_Expr).super_ASTNode._vptr_ASTNode = (_func_int **)&PTR__ASTNode_00194808;
  this->value_ = *value;
  return;
}

Assistant:

explicit LiteralExpr(const T& value)
      : LiteralExpr(value, SourceLocation()) {}